

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fClippingTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_0::ColoredLineCase::ColoredLineCase
          (ColoredLineCase *this,Context *context,char *name,char *description,
          ColoredLineData *linesBegin,ColoredLineData *linesEnd,float lineWidth,
          WindowRectangle *viewport)

{
  pointer __result;
  ColoredLineData *pCVar1;
  char *pcVar2;
  _Vector_base<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
  *this_00;
  
  pcVar2 = "line attribute clipping";
  RenderTestCase::RenderTestCase((RenderTestCase *)this,context,name,"line attribute clipping");
  (this->super_LineRenderTestCase).super_RenderTestCase.super_TestCase.super_TestCase.super_TestNode
  ._vptr_TestNode = (_func_int **)&PTR__LineRenderTestCase_01e19890;
  (this->super_LineRenderTestCase).m_lineWidth = lineWidth;
  (this->super_LineRenderTestCase).m_lines.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_LineRenderTestCase).m_lines.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_LineRenderTestCase).m_lines.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = (_Vector_base<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
             *)((long)linesBegin - (long)description >> 6);
  if ((ulong)this_00 >> 0x39 == 0) {
    __result = std::
               _Vector_base<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
               ::_M_allocate(this_00,(size_t)context);
    (this->super_LineRenderTestCase).m_lines.
    super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->super_LineRenderTestCase).m_lines.
    super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(((long)linesBegin - (long)description) + (long)__result);
    pCVar1 = std::
             __uninitialized_copy_a<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData_const*,deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData*,deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>
                       ((ColoredLineData *)description,linesBegin,__result,
                        (allocator<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>
                         *)pcVar2);
    (this->super_LineRenderTestCase).m_lines.
    super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
    ._M_impl.super__Vector_impl_data._M_finish = pCVar1;
    (this->super_LineRenderTestCase).m_viewport.left = 0;
    (this->super_LineRenderTestCase).m_viewport.bottom = 0;
    (this->super_LineRenderTestCase).m_viewport.width = 200;
    (this->super_LineRenderTestCase).m_viewport.height = 200;
    (this->super_LineRenderTestCase).super_RenderTestCase.super_TestCase.super_TestCase.
    super_TestNode._vptr_TestNode = (_func_int **)&PTR__LineRenderTestCase_01e198d8;
    return;
  }
  std::__throw_length_error("cannot create std::vector larger than max_size()");
}

Assistant:

ColoredLineCase::ColoredLineCase (Context& context, const char* name, const char* description, const LineRenderTestCase::ColoredLineData* linesBegin, const LineRenderTestCase::ColoredLineData* linesEnd, float lineWidth, const rr::WindowRectangle& viewport)
	: LineRenderTestCase (context, name, description, linesBegin, linesEnd, lineWidth, viewport)
{
}